

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprListSetName(Parse *pParse,ExprList *pList,Token *pName,int dequote)

{
  int iVar1;
  char *z;
  
  if (pList != (ExprList *)0x0) {
    iVar1 = pList->nExpr;
    z = sqlite3DbStrNDup(pParse->db,pName->z,(ulong)pName->n);
    pList->a[(long)iVar1 + -1].zEName = z;
    if (dequote != 0) {
      sqlite3Dequote(z);
      if (1 < pParse->eParseMode) {
        sqlite3RenameTokenMap(pParse,pList->a[(long)iVar1 + -1].zEName,pName);
        return;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetName(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  const Token *pName,     /* Name to be added */
  int dequote             /* True to cause the name to be dequoted */
){
  assert( pList!=0 || pParse->db->mallocFailed!=0 );
  assert( pParse->eParseMode!=PARSE_MODE_UNMAP || dequote==0 );
  if( pList ){
    struct ExprList_item *pItem;
    assert( pList->nExpr>0 );
    pItem = &pList->a[pList->nExpr-1];
    assert( pItem->zEName==0 );
    assert( pItem->fg.eEName==ENAME_NAME );
    pItem->zEName = sqlite3DbStrNDup(pParse->db, pName->z, pName->n);
    if( dequote ){
      /* If dequote==0, then pName->z does not point to part of a DDL
      ** statement handled by the parser. And so no token need be added
      ** to the token-map.  */
      sqlite3Dequote(pItem->zEName);
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenMap(pParse, (const void*)pItem->zEName, pName);
      }
    }
  }
}